

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerQueue.h
# Opt level: O2

void __thiscall
WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::WorkerQueue(WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *this,int numWorkers,
             basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_00;
  bool bVar1;
  thread local_58;
  type local_50;
  condition_variable *local_48;
  WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *local_40;
  WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *local_38;
  
  std::_Deque_base<std::thread,_std::allocator<std::thread>_>::_Deque_base
            ((_Deque_base<std::thread,_std::allocator<std::thread>_> *)this);
  local_48 = (condition_variable *)(this + 0x50);
  std::condition_variable::condition_variable(local_48);
  *(undefined4 *)(this + 0xac) = 0;
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined8 *)(this + 0x98) = 0;
  *(undefined8 *)(this + 0x99) = 0;
  *(undefined8 *)(this + 0xa1) = 0;
  std::
  queue<std::deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>,std::deque<std::deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>,std::allocator<std::deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>>>>
  ::
  queue<std::deque<std::deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>,std::allocator<std::deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>>>,void>
            ((queue<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::deque<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::allocator<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>_>_>
              *)(this + 0xb0));
  this_00 = this + 0x110;
  *(undefined8 *)(this + 0x100) = 0;
  *(undefined8 *)(this + 0x108) = 0;
  local_40 = this + 0xb0;
  std::
  _Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
  ::_Deque_base((_Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
                 *)this_00);
  local_38 = this_00;
  if (numWorkers < 1) {
    numWorkers = std::thread::hardware_concurrency();
  }
  while (bVar1 = numWorkers != 0, numWorkers = numWorkers + -1, bVar1) {
    local_50.this =
         (WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *)this;
    std::thread::
    thread<WorkerQueue<SearchResultsWriterWorker<DNA>,std::deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>,std::__cxx11::string_const&>::WorkerQueue(int,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_,std::__cxx11::string_const&,void>
              (&local_58,&local_50,args);
    std::deque<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              ((deque<std::thread,_std::allocator<std::thread>_> *)this,&local_58);
    std::thread::~thread(&local_58);
  }
  return;
}

Assistant:

WorkerQueue( const int numWorkers = 1, Args... args )
      : mStop( false ), mWorkingCount( 0 ), mTotalEnqueued( 0 ),
        mTotalProcessed( 0 ) {
    auto actualWorkers =
      numWorkers <= 0 ? std::thread::hardware_concurrency() : numWorkers;

    for( int i = 0; i < actualWorkers; i++ ) {
      mWorkers.push_back( std::thread(
        [this]( Args&&... args ) {
          this->WorkerLoop( std::forward< Args >( args )... );
        },
        args... ) );
    }
  }